

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O2

int __thiscall vkt::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"info",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Build and Device Info Tests",&local_52);
  pTVar2 = &createTestGroup(pTVar1,&local_30,&local_50,createInfoTests)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar2 = &api::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &vkt::memory::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &vkt::pipeline::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &BindingModel::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &SpirVAssembly::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"glsl",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GLSL shader execution tests",&local_52);
  pTVar2 = &createTestGroup(pTVar1,&local_30,&local_50,createGlslTests)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar2 = &createRenderPassTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &ubo::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &DynamicState::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &ssbo::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &QueryPool::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &Draw::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &compute::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &vkt::image::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &wsi::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &synchronization::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &sparse::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &tessellation::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &rasterization::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &clipping::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &FragmentOperations::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &vkt::texture::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = &geometry::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void TestPackage::init (void)
{
	addChild(createTestGroup				(m_testCtx, "info", "Build and Device Info Tests", createInfoTests));
	addChild(api::createTests				(m_testCtx));
	addChild(memory::createTests			(m_testCtx));
	addChild(pipeline::createTests			(m_testCtx));
	addChild(BindingModel::createTests		(m_testCtx));
	addChild(SpirVAssembly::createTests		(m_testCtx));
	addChild(createTestGroup				(m_testCtx, "glsl", "GLSL shader execution tests", createGlslTests));
	addChild(createRenderPassTests			(m_testCtx));
	addChild(ubo::createTests				(m_testCtx));
	addChild(DynamicState::createTests		(m_testCtx));
	addChild(ssbo::createTests				(m_testCtx));
	addChild(QueryPool::createTests			(m_testCtx));
	addChild(Draw::createTests				(m_testCtx));
	addChild(compute::createTests			(m_testCtx));
	addChild(image::createTests				(m_testCtx));
	addChild(wsi::createTests				(m_testCtx));
	addChild(synchronization::createTests	(m_testCtx));
	addChild(sparse::createTests			(m_testCtx));
	addChild(tessellation::createTests		(m_testCtx));
	addChild(rasterization::createTests		(m_testCtx));
	addChild(clipping::createTests			(m_testCtx));
	addChild(FragmentOperations::createTests(m_testCtx));
	addChild(texture::createTests			(m_testCtx));
	addChild(geometry::createTests			(m_testCtx));
}